

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

void reduce_min_max(uint8_t *v1,uint8_t *v2)

{
  bool bVar1;
  uint8_t local_14;
  uint8_t local_13;
  bool p_or_d2;
  bool parent_or_depth;
  uint8_t *v2_local;
  uint8_t *v1_local;
  
  bVar1 = (*v1 & 0x80) != 0;
  if (bVar1 == ((*v2 & 0x80) != 0)) {
    if (bVar1) {
      if (*v1 < *v2) {
        local_13 = *v2;
      }
      else {
        local_13 = *v1;
      }
      *v1 = local_13;
    }
    else if (*v1 == '\x7f') {
      *v1 = *v2;
    }
    else if (*v2 != '\x7f') {
      if (*v2 < *v1) {
        local_14 = *v2;
      }
      else {
        local_14 = *v1;
      }
      *v1 = local_14;
    }
  }
  return;
}

Assistant:

void reduce_min_max(uint8_t &v1, const uint8_t &v2)
{
  bool parent_or_depth;
  if (v1 & indicator_bit)
    parent_or_depth = true;
  else
    parent_or_depth = false;
  bool p_or_d2;
  if (v2 & indicator_bit)
    p_or_d2 = true;
  else
    p_or_d2 = false;
  if (parent_or_depth != p_or_d2)
  {
#ifdef DEBUG
    cout << "Reducing parent with depth!!!!!";
#endif  // DEBUG
    return;
  }

  if (parent_or_depth)
    v1 = (v1 >= v2) ? v1 : v2;
  else
  {
    if (v1 == default_depth)
      v1 = v2;
    else if (v2 != default_depth)
      v1 = (v1 <= v2) ? v1 : v2;
  }
}